

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,char *d)

{
  Directory DVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *pcVar4;
  string local_e0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string path;
  undefined1 local_90 [8];
  string file;
  uint i;
  size_t numf;
  allocator<char> local_49;
  string local_48;
  Directory local_28;
  Directory dir;
  char *d_local;
  cmParseCacheCoverage *this_local;
  
  dir.Internal = (DirectoryInternals *)d;
  cmsys::Directory::Directory(&local_28);
  DVar1.Internal = dir.Internal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)DVar1.Internal,&local_49);
  bVar2 = cmsys::Directory::Load(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_28);
    for (file.field_2._12_4_ = 0; (uint)file.field_2._12_4_ < uVar3;
        file.field_2._12_4_ = file.field_2._12_4_ + 1) {
      pcVar4 = cmsys::Directory::GetFile(&local_28,(ulong)(uint)file.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,pcVar4,(allocator<char> *)(path.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,".");
      if (((!bVar2) ||
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_90,".."), !bVar2)) ||
         (bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_90), DVar1 = dir, bVar2)) {
LAB_001ae0b8:
        bVar2 = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,(char *)DVar1.Internal,&local_b9);
        std::allocator<char>::~allocator(&local_b9);
        std::__cxx11::string::operator+=((string *)local_b8,"/");
        std::__cxx11::string::operator+=((string *)local_b8,(string *)local_90);
        cmsys::SystemTools::GetFilenameLastExtension(&local_e0,(string *)local_b8);
        bVar2 = std::operator==(&local_e0,".cmcov");
        std::__cxx11::string::~string((string *)&local_e0);
        if (bVar2) {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar2 = ReadCMCovFile(this,pcVar4);
          if (bVar2) goto LAB_001ae08c;
          this_local._7_1_ = 0;
          bVar2 = true;
        }
        else {
LAB_001ae08c:
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)local_b8);
        if (!bVar2) goto LAB_001ae0b8;
      }
      std::__cxx11::string::~string((string *)local_90);
      if (bVar2) goto LAB_001ae0fd;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001ae0fd:
  cmsys::Directory::~Directory(&local_28);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(const char* d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = d;
      path += "/";
      path += file;
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}